

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O0

int Cudd_DumpDot(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  uint uVar1;
  char *pcVar2;
  DdNode **ppDVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  st__generator *gen_00;
  ulong local_a0;
  long mask;
  long diff;
  long refAddr;
  DdNodePtr *nodelist;
  int slots;
  int j;
  int i;
  int retval;
  st__generator *gen;
  st__table *visited;
  int nvars;
  int *sorted;
  DdNode *scan;
  DdNode *support;
  FILE *fp_local;
  char **onames_local;
  char **inames_local;
  DdNode **f_local;
  DdManager *pDStack_18;
  int n_local;
  DdManager *dd_local;
  
  scan = (DdNode *)0x0;
  iVar5 = dd->size;
  gen = (st__generator *)0x0;
  support = (DdNode *)fp;
  fp_local = (FILE *)onames;
  onames_local = inames;
  inames_local = (char **)f;
  f_local._4_4_ = n;
  pDStack_18 = dd;
  __ptr = malloc((long)iVar5 << 2);
  if (__ptr == (void *)0x0) {
    pDStack_18->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    for (slots = 0; slots < iVar5; slots = slots + 1) {
      *(undefined4 *)((long)__ptr + (long)slots * 4) = 0;
    }
    scan = Cudd_VectorSupport(pDStack_18,(DdNode **)inames_local,f_local._4_4_);
    if (scan == (DdNode *)0x0) {
      scan = (DdNode *)0x0;
    }
    else {
      *(int *)(((ulong)scan & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)scan & 0xfffffffffffffffe) + 4) + 1;
      for (sorted = (int *)scan; *sorted != 0x7fffffff; sorted = *(int **)(sorted + 4)) {
        *(undefined4 *)((long)__ptr + (ulong)(uint)*sorted * 4) = 1;
      }
      Cudd_RecursiveDeref(pDStack_18,scan);
      scan = (DdNode *)0x0;
      gen = (st__generator *)st__init_table(st__ptrcmp,st__ptrhash);
      if ((st__table *)gen != (st__table *)0x0) {
        for (slots = 0; slots < f_local._4_4_; slots = slots + 1) {
          iVar4 = cuddCollectNodes((DdNode *)((ulong)inames_local[slots] & 0xfffffffffffffffe),
                                   (st__table *)gen);
          if (iVar4 == 0) goto LAB_00c14793;
        }
        pcVar2 = *inames_local;
        mask = 0;
        gen_00 = st__init_gen((st__table *)gen);
        if (gen_00 != (st__generator *)0x0) {
          while (iVar4 = st__gen(gen_00,(char **)&sorted,(char **)0x0), iVar4 != 0) {
            mask = (ulong)pcVar2 & 0xfffffffffffffffe ^ (ulong)sorted | mask;
          }
          st__free_gen(gen_00);
          slots = 0;
          while (((uint)slots < 0x40 &&
                 (local_a0 = (ulong)((1 << ((byte)slots & 0x1f)) + -1), (long)local_a0 < mask))) {
            slots = slots + 4;
          }
          iVar4 = fprintf((FILE *)support,"digraph \"DD\" {\n");
          if (iVar4 == -1) {
            return 0;
          }
          iVar4 = fprintf((FILE *)support,"size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n")
          ;
          if (iVar4 == -1) {
            return 0;
          }
          iVar4 = fprintf((FILE *)support,"{ node [shape = plaintext];\n");
          if (((iVar4 != -1) &&
              (iVar4 = fprintf((FILE *)support,"  edge [style = invis];\n"), iVar4 != -1)) &&
             (iVar4 = fprintf((FILE *)support,"  \"CONST NODES\" [style = invis];\n"), iVar4 != -1))
          {
            for (slots = 0; slots < iVar5; slots = slots + 1) {
              if (*(int *)((long)__ptr + (long)pDStack_18->invperm[slots] * 4) != 0) {
                if ((onames_local == (char **)0x0) ||
                   (onames_local[pDStack_18->invperm[slots]] == (char *)0x0)) {
                  j = fprintf((FILE *)support,"\" %d \" -> ",(ulong)(uint)pDStack_18->invperm[slots]
                             );
                }
                else {
                  j = fprintf((FILE *)support,"\" %s \" -> ",
                              onames_local[pDStack_18->invperm[slots]]);
                }
                if (j == -1) goto LAB_00c14793;
              }
            }
            iVar4 = fprintf((FILE *)support,"\"CONST NODES\"; \n}\n");
            if ((iVar4 != -1) &&
               (iVar4 = fprintf((FILE *)support,
                                "{ rank = same; node [shape = box]; edge [style = invis];\n"),
               iVar4 != -1)) {
              for (slots = 0; slots < f_local._4_4_; slots = slots + 1) {
                if (fp_local == (FILE *)0x0) {
                  j = fprintf((FILE *)support,"\"F%d\"",(ulong)(uint)slots);
                }
                else {
                  j = fprintf((FILE *)support,"\"  %s  \"",
                              *(undefined8 *)(&fp_local->_flags + (long)slots * 2));
                }
                if (j == -1) goto LAB_00c14793;
                if (slots == f_local._4_4_ + -1) {
                  j = fprintf((FILE *)support,"; }\n");
                }
                else {
                  j = fprintf((FILE *)support," -> ");
                }
                if (j == -1) goto LAB_00c14793;
              }
              for (slots = 0; slots < iVar5; slots = slots + 1) {
                if (*(int *)((long)__ptr + (long)pDStack_18->invperm[slots] * 4) != 0) {
                  iVar4 = fprintf((FILE *)support,"{ rank = same; ");
                  if (iVar4 == -1) goto LAB_00c14793;
                  if ((onames_local == (char **)0x0) ||
                     (onames_local[pDStack_18->invperm[slots]] == (char *)0x0)) {
                    j = fprintf((FILE *)support,"\" %d \";\n",
                                (ulong)(uint)pDStack_18->invperm[slots]);
                  }
                  else {
                    j = fprintf((FILE *)support,"\" %s \";\n",
                                onames_local[pDStack_18->invperm[slots]]);
                  }
                  if (j == -1) goto LAB_00c14793;
                  ppDVar3 = pDStack_18->subtables[slots].nodelist;
                  uVar1 = pDStack_18->subtables[slots].slots;
                  for (nodelist._4_4_ = 0; nodelist._4_4_ < (int)uVar1;
                      nodelist._4_4_ = nodelist._4_4_ + 1) {
                    for (sorted = (int *)ppDVar3[nodelist._4_4_]; sorted != (int *)0x0;
                        sorted = *(int **)(sorted + 2)) {
                      iVar4 = st__lookup((st__table *)gen,(char *)sorted,(char **)0x0);
                      if ((iVar4 != 0) &&
                         (iVar4 = fprintf((FILE *)support,"\"%lx\";\n",
                                          (local_a0 & (ulong)sorted) / 0x28), iVar4 == -1))
                      goto LAB_00c14793;
                    }
                  }
                  iVar4 = fprintf((FILE *)support,"}\n");
                  if (iVar4 == -1) goto LAB_00c14793;
                }
              }
              iVar4 = fprintf((FILE *)support,
                              "{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
              if (iVar4 != -1) {
                ppDVar3 = (pDStack_18->constants).nodelist;
                uVar1 = (pDStack_18->constants).slots;
                for (nodelist._4_4_ = 0; nodelist._4_4_ < (int)uVar1;
                    nodelist._4_4_ = nodelist._4_4_ + 1) {
                  for (sorted = (int *)ppDVar3[nodelist._4_4_]; sorted != (int *)0x0;
                      sorted = *(int **)(sorted + 2)) {
                    iVar4 = st__lookup((st__table *)gen,(char *)sorted,(char **)0x0);
                    if ((iVar4 != 0) &&
                       (iVar4 = fprintf((FILE *)support,"\"%lx\";\n",
                                        (local_a0 & (ulong)sorted) / 0x28), iVar4 == -1))
                    goto LAB_00c14793;
                  }
                }
                iVar4 = fprintf((FILE *)support,"}\n}\n");
                if (iVar4 != -1) {
                  for (slots = 0; slots < f_local._4_4_; slots = slots + 1) {
                    if (fp_local == (FILE *)0x0) {
                      j = fprintf((FILE *)support,"\"F%d\"",(ulong)(uint)slots);
                    }
                    else {
                      j = fprintf((FILE *)support,"\"  %s  \"",
                                  *(undefined8 *)(&fp_local->_flags + (long)slots * 2));
                    }
                    if (j == -1) goto LAB_00c14793;
                    if (((ulong)inames_local[slots] & 1) == 0) {
                      j = fprintf((FILE *)support," -> \"%lx\" [style = solid];\n",
                                  (local_a0 & (ulong)inames_local[slots]) / 0x28);
                    }
                    else {
                      j = fprintf((FILE *)support," -> \"%lx\" [style = dotted];\n",
                                  (local_a0 & (ulong)inames_local[slots]) / 0x28);
                    }
                    if (j == -1) goto LAB_00c14793;
                  }
                  for (slots = 0; slots < iVar5; slots = slots + 1) {
                    if (*(int *)((long)__ptr + (long)pDStack_18->invperm[slots] * 4) != 0) {
                      ppDVar3 = pDStack_18->subtables[slots].nodelist;
                      uVar1 = pDStack_18->subtables[slots].slots;
                      for (nodelist._4_4_ = 0; nodelist._4_4_ < (int)uVar1;
                          nodelist._4_4_ = nodelist._4_4_ + 1) {
                        for (sorted = (int *)ppDVar3[nodelist._4_4_]; sorted != (int *)0x0;
                            sorted = *(int **)(sorted + 2)) {
                          iVar4 = st__lookup((st__table *)gen,(char *)sorted,(char **)0x0);
                          if (iVar4 != 0) {
                            iVar4 = fprintf((FILE *)support,"\"%lx\" -> \"%lx\";\n",
                                            (local_a0 & (ulong)sorted) / 0x28,
                                            (local_a0 & *(ulong *)(sorted + 4)) / 0x28);
                            if (iVar4 == -1) goto LAB_00c14793;
                            if ((*(ulong *)(sorted + 6) & 1) == 0) {
                              j = fprintf((FILE *)support,"\"%lx\" -> \"%lx\" [style = dashed];\n",
                                          (local_a0 & (ulong)sorted) / 0x28,
                                          (local_a0 & *(ulong *)(sorted + 6)) / 0x28);
                            }
                            else {
                              j = fprintf((FILE *)support,"\"%lx\" -> \"%lx\" [style = dotted];\n",
                                          (local_a0 & (ulong)sorted) / 0x28,
                                          (local_a0 & *(ulong *)(sorted + 6)) / 0x28);
                            }
                            if (j == -1) goto LAB_00c14793;
                          }
                        }
                      }
                    }
                  }
                  ppDVar3 = (pDStack_18->constants).nodelist;
                  uVar1 = (pDStack_18->constants).slots;
                  for (nodelist._4_4_ = 0; nodelist._4_4_ < (int)uVar1;
                      nodelist._4_4_ = nodelist._4_4_ + 1) {
                    for (sorted = (int *)ppDVar3[nodelist._4_4_]; sorted != (int *)0x0;
                        sorted = *(int **)(sorted + 2)) {
                      iVar5 = st__lookup((st__table *)gen,(char *)sorted,(char **)0x0);
                      if ((iVar5 != 0) &&
                         (iVar5 = fprintf((FILE *)support,"\"%lx\" [label = \"%g\"];\n",
                                          *(undefined8 *)(sorted + 4),
                                          (local_a0 & (ulong)sorted) / 0x28), iVar5 == -1))
                      goto LAB_00c14793;
                    }
                  }
                  iVar5 = fprintf((FILE *)support,"}\n");
                  if (iVar5 != -1) {
                    st__free_table((st__table *)gen);
                    if (__ptr != (void *)0x0) {
                      free(__ptr);
                    }
                    return 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00c14793:
  if ((__ptr != (void *)0x0) && (__ptr != (void *)0x0)) {
    free(__ptr);
  }
  if (scan != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pDStack_18,scan);
  }
  if (gen != (st__generator *)0x0) {
    st__free_table((st__table *)gen);
  }
  return 0;
}

Assistant:

int
Cudd_DumpDot(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->size;
    st__table    *visited = NULL;
    st__generator *gen = NULL;
    int         retval;
    int         i, j;
    int         slots;
    DdNodePtr   *nodelist;
    long        refAddr, diff, mask;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (long) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    if (gen == NULL) goto failure;
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (long) scan;
    }
    st__free_gen(gen); gen = NULL;

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(long); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }

    /* Write the header and the global attributes. */
    retval = fprintf(fp,"digraph \"DD\" {\n");
    if (retval == EOF) return(0);
    retval = fprintf(fp,
        "size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
    if (retval == EOF) return(0);

    /* Write the input name subgraph by scanning the support array. */
    retval = fprintf(fp,"{ node [shape = plaintext];\n");
    if (retval == EOF) goto failure;
    retval = fprintf(fp,"  edge [style = invis];\n");
    if (retval == EOF) goto failure;
    /* We use a name ("CONST NODES") with an embedded blank, because
    ** it is unlikely to appear as an input name.
    */
    retval = fprintf(fp,"  \"CONST NODES\" [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"\" %d \" -> ", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"\" %s \" -> ", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
        }
    }
    retval = fprintf(fp,"\"CONST NODES\"; \n}\n");
    if (retval == EOF) goto failure;

    /* Write the output node subgraph. */
    retval = fprintf(fp,"{ rank = same; node [shape = box]; edge [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        if (i == n - 1) {
            retval = fprintf(fp,"; }\n");
        } else {
            retval = fprintf(fp," -> ");
        }
        if (retval == EOF) goto failure;
    }

    /* Write rank info: All nodes with the same index have the same rank. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            retval = fprintf(fp,"{ rank = same; ");
            if (retval == EOF) goto failure;
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"\" %d \";\n", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"\" %s \";\n", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
            nodelist = dd->subtables[i].nodelist;
            slots = dd->subtables[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp,"\"%lx\";\n", ((mask & (ptrint) scan) / sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
            retval = fprintf(fp,"}\n");
            if (retval == EOF) goto failure;
        }
    }

    /* All constants have the same rank. */
    retval = fprintf(fp,
        "{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
    if (retval == EOF) goto failure;
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%lx\";\n", ((mask & (ptrint) scan) / sizeof(DdNode)));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }
    retval = fprintf(fp,"}\n}\n");
    if (retval == EOF) goto failure;

    /* Write edge info. */
    /* Edges from the output nodes. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        /* Account for the possible complement on the root. */
        if (Cudd_IsComplement(f[i])) {
            retval = fprintf(fp," -> \"%lx\" [style = dotted];\n", ((mask & (ptrint) f[i]) / sizeof(DdNode)));
        } else {
            retval = fprintf(fp," -> \"%lx\" [style = solid];\n", ((mask & (ptrint) f[i]) / sizeof(DdNode)));
        }
        if (retval == EOF) goto failure;
    }

    /* Edges from internal nodes. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            nodelist = dd->subtables[i].nodelist;
            slots = dd->subtables[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp, "\"%lx\" -> \"%lx\";\n", 
                            ((mask & (ptrint) scan) / sizeof(DdNode)),
                            ((mask & (ptrint) cuddT(scan)) / sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                        if (Cudd_IsComplement(cuddE(scan))) {
                            retval = fprintf(fp,"\"%lx\" -> \"%lx\" [style = dotted];\n", 
                                ((mask & (ptrint) scan) / sizeof(DdNode)),
                                ((mask & (ptrint) cuddE(scan)) / sizeof(DdNode)));
                        } else {
                            retval = fprintf(fp, "\"%lx\" -> \"%lx\" [style = dashed];\n", 
                                ((mask & (ptrint) scan) / sizeof(DdNode)),
                                ((mask & (ptrint) cuddE(scan)) / sizeof(DdNode)));
                        }
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
        }
    }

    /* Write constant labels. */
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%lx\" [label = \"%g\"];\n", 
                    ((mask & (ptrint) scan) / sizeof(DdNode)), cuddV(scan));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }

    /* Write trailer and return. */
    retval = fprintf(fp,"}\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    ABC_FREE(sorted);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}